

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend(TPZGeoBlend<pzgeom::TPZGeoLinear> *this)

{
  long lVar1;
  
  *(undefined4 *)(this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes + 4) =
       0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes + 1) =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes + 0xc) =
       0xffffffff;
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_018b6630;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x30);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform
              ((TPZTransform<double> *)((long)(this->fNeighbours + 2) + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x340);
  return;
}

Assistant:

TPZGeoBlend() : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                        TGeo() {
        }